

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O1

string * __thiscall
google::protobuf::util::status_internal::Status::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Status *this)

{
  StatusCode SVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  StatusCode in_EDX;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string local_38;
  
  SVar1 = this->error_code_;
  if (SVar1 == kOk) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"OK","");
  }
  else if ((this->error_message_)._M_string_length == 0) {
    (anonymous_namespace)::StatusCodeToString_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)(ulong)SVar1,in_EDX);
  }
  else {
    (anonymous_namespace)::StatusCodeToString_abi_cxx11_
              (&local_38,(_anonymous_namespace_ *)(ulong)SVar1,in_EDX);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_38);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_48 = *plVar4;
      lStack_40 = plVar3[3];
      local_58 = &local_48;
    }
    else {
      local_48 = *plVar4;
      local_58 = (long *)*plVar3;
    }
    local_50 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_58,(ulong)(this->error_message_)._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      lVar2 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_58 != &local_48) {
      operator_delete(local_58);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Status::ToString() const {
  if (error_code_ == StatusCode::kOk) {
    return "OK";
  } else {
    if (error_message_.empty()) {
      return StatusCodeToString(error_code_);
    } else {
      return StatusCodeToString(error_code_) + ":" + error_message_;
    }
  }
}